

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void discrete_dist_test<trng::discrete_dist>(discrete_dist *d)

{
  bool bVar1;
  undefined1 uVar2;
  Section *catch_internal_Section6;
  Section *catch_internal_Section5;
  Section *catch_internal_Section4;
  SectionInfo *in_stack_fffffffffffffc30;
  SectionInfo *this;
  undefined7 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3f;
  SectionInfo *in_stack_fffffffffffffc40;
  SectionInfo *this_00;
  allocator<char> local_3a1;
  string local_3a0 [8];
  SectionInfo *in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  SourceLineInfo local_380 [4];
  Section *in_stack_fffffffffffffcc0;
  discrete_dist *in_stack_fffffffffffffd30;
  undefined1 local_271 [33];
  SourceLineInfo local_250 [15];
  discrete_dist *in_stack_fffffffffffffea0;
  allocator local_131;
  string local_130 [32];
  discrete_dist *in_stack_fffffffffffffef0;
  Section local_b0;
  Section *local_10;
  
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)&stack0xfffffffffffffef0,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0x12d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"test pdf & cdf",&local_131);
  Catch::SectionInfo::SectionInfo
            (in_stack_fffffffffffffc40,
             (SourceLineInfo *)CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38),
             &in_stack_fffffffffffffc30->name);
  Catch::Section::Section((Section *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  Catch::SectionInfo::~SectionInfo(in_stack_fffffffffffffc30);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_10 = &local_b0;
  bVar1 = Catch::Section::operator_cast_to_bool(local_10);
  if (bVar1) {
    discrete_dist_test_pdf<trng::discrete_dist>(in_stack_fffffffffffffd30);
  }
  Catch::Section::~Section(in_stack_fffffffffffffcc0);
  Catch::SourceLineInfo::SourceLineInfo
            (local_250,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0x130);
  this_00 = (SectionInfo *)local_271;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_271 + 1),"chi2_test",(allocator *)this_00);
  Catch::SectionInfo::SectionInfo
            (this_00,(SourceLineInfo *)CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38)
             ,&in_stack_fffffffffffffc30->name);
  Catch::Section::Section((Section *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  Catch::SectionInfo::~SectionInfo(in_stack_fffffffffffffc30);
  std::__cxx11::string::~string((string *)(local_271 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_271);
  uVar2 = Catch::Section::operator_cast_to_bool((Section *)(local_250 + 6));
  if ((bool)uVar2) {
    discrete_dist_test_chi2_test<trng::discrete_dist>(in_stack_fffffffffffffea0);
  }
  Catch::Section::~Section(in_stack_fffffffffffffcc0);
  Catch::SourceLineInfo::SourceLineInfo
            (local_380,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0x133);
  this = (SectionInfo *)&local_3a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a0,"streamable",(allocator *)this);
  Catch::SectionInfo::SectionInfo
            (this_00,(SourceLineInfo *)CONCAT17(uVar2,in_stack_fffffffffffffc38),&this->name);
  Catch::Section::Section((Section *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  Catch::SectionInfo::~SectionInfo(this);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  bVar1 = Catch::Section::operator_cast_to_bool((Section *)&stack0xfffffffffffffce0);
  if (bVar1) {
    discrete_dist_test_streamable<trng::discrete_dist>(in_stack_fffffffffffffef0);
  }
  Catch::Section::~Section(in_stack_fffffffffffffcc0);
  return;
}

Assistant:

void discrete_dist_test(T &d) {
  SECTION("test pdf & cdf") {
    discrete_dist_test_pdf(d);
  }
  SECTION("chi2_test") {
    discrete_dist_test_chi2_test(d);
  }
  SECTION("streamable") {
    discrete_dist_test_streamable(d);
  }
}